

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

bool __thiscall
tinyusdz::Attribute::get_value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
          (Attribute *this,vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *v)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char cVar4;
  optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> local_78;
  char local_50;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_48;
  
  if (v == (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)0x0) {
    cVar4 = '\0';
  }
  else {
    primvar::PrimVar::get_value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
              (&local_78,&this->_var);
    uVar3 = local_78.contained._16_8_;
    uVar2 = local_78.contained._8_8_;
    uVar1 = local_78.contained.data._0_8_;
    cVar4 = local_78.has_value_;
    local_50 = local_78.has_value_;
    if (local_78.has_value_ != false) {
      local_78.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_78.contained._8_8_ = 0;
      local_78.contained._16_8_ = 0;
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_78.contained);
      local_78.contained._8_8_ =
           (v->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (v->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)uVar3;
      local_78._0_8_ =
           (v->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl.
           super__Vector_impl_data._M_start;
      local_78.contained.data._0_8_ =
           (undefined8)
           (v->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      (v->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)uVar1;
      (v->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)uVar2;
      local_48.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_78);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_48);
    }
  }
  return (bool)cVar4;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }